

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::_::Tuple<>_> __thiscall
kj::parse::Times_<kj::parse::Exactly_<char>_>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>::apply
          (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> *this,
          Exactly_<char> *subParser,uint count,IteratorInput<char,_const_char_*> *input)

{
  bool bVar1;
  NullableValue<kj::_::Tuple<>_> *other;
  Tuple<> *pTVar2;
  Tuple<> local_41;
  uint local_40;
  Maybe<kj::_::Tuple<>_> local_30;
  NullableValue<kj::_::Tuple<>_> local_2e;
  uint local_2c;
  NullableValue<kj::_::Tuple<>_> subResult;
  IteratorInput<char,_const_char_*> *pIStack_28;
  uint actualCount;
  IteratorInput<char,_const_char_*> *input_local;
  uint count_local;
  Exactly_<char> *subParser_local;
  
  local_2c = 0;
  pIStack_28 = input;
  while( true ) {
    if (count <= local_2c) {
      tuple<>();
      Maybe<kj::_::Tuple<>_>::Maybe((Maybe<kj::_::Tuple<>_> *)this,&local_41);
      goto LAB_003f4b7f;
    }
    bVar1 = IteratorInput<char,_const_char_*>::atEnd(pIStack_28);
    if (bVar1) break;
    Exactly_<char>::operator()
              ((Exactly_<char> *)&local_30,(IteratorInput<char,_const_char_*> *)subParser);
    other = kj::_::readMaybe<kj::_::Tuple<>>(&local_30);
    kj::_::NullableValue<kj::_::Tuple<>_>::NullableValue(&local_2e,other);
    Maybe<kj::_::Tuple<>_>::~Maybe(&local_30);
    pTVar2 = kj::_::NullableValue::operator_cast_to_Tuple_((NullableValue *)&local_2e);
    if (pTVar2 == (Tuple<> *)0x0) {
      Maybe<kj::_::Tuple<>_>::Maybe((Maybe<kj::_::Tuple<>_> *)this,(void *)0x0);
    }
    else {
      local_2c = local_2c + 1;
    }
    local_40 = (uint)(pTVar2 == (Tuple<> *)0x0);
    kj::_::NullableValue<kj::_::Tuple<>_>::~NullableValue(&local_2e);
    if (local_40 != 0) {
LAB_003f4b7f:
      return (Maybe<kj::_::Tuple<>_>)SUB82(this,0);
    }
  }
  Maybe<kj::_::Tuple<>_>::Maybe((Maybe<kj::_::Tuple<>_> *)this,(void *)0x0);
  goto LAB_003f4b7f;
}

Assistant:

static Maybe<Tuple<>> apply(const SubParser& subParser, uint count, Input& input) {
    uint actualCount = 0;

    while (actualCount < count) {
      if (input.atEnd()) {
        return nullptr;
      } else KJ_IF_MAYBE(subResult, subParser(input)) {
        ++actualCount;
      } else {
        return nullptr;
      }
    }

    return tuple();
  }